

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O3

void jpeg_idct_islow(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  short sVar1;
  JSAMPLE *pJVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  JSAMPLE JVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  JSAMPLE *pJVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  undefined1 auVar32 [16];
  int aiStack_154 [7];
  int aiStack_138 [66];
  
  pJVar2 = cinfo->sample_range_limit;
  pvVar3 = compptr->dct_table;
  uVar16 = 9;
  lVar20 = 0;
  do {
    sVar1 = *(short *)((long)coef_block + lVar20 + 0x10);
    sVar7 = *(short *)((long)coef_block + lVar20 + 0x20);
    if (sVar7 == 0 && sVar1 == 0) {
      if ((((*(short *)((long)coef_block + lVar20 + 0x30) != 0) ||
           (*(short *)((long)coef_block + lVar20 + 0x40) != 0)) ||
          (*(short *)((long)coef_block + lVar20 + 0x50) != 0)) ||
         ((*(short *)((long)coef_block + lVar20 + 0x60) != 0 ||
          (*(short *)((long)coef_block + lVar20 + 0x70) != 0)))) {
        sVar7 = 0;
        goto LAB_00146020;
      }
      iVar9 = (int)*(short *)((long)pvVar3 + lVar20) * (int)*(short *)((long)coef_block + lVar20) *
              4;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x1c) = iVar9;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x3c) = iVar9;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x5c) = iVar9;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x7c) = iVar9;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x9c) = iVar9;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0xbc) = iVar9;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0xdc) = iVar9;
      lVar23 = 0xe0;
    }
    else {
LAB_00146020:
      lVar23 = (long)*(short *)((long)pvVar3 + lVar20 + 0x20) * (long)sVar7;
      lVar27 = (long)*(short *)((long)pvVar3 + lVar20 + 0x60) *
               (long)*(short *)((long)coef_block + lVar20 + 0x60);
      lVar10 = (lVar27 + lVar23) * 0x1151;
      lVar14 = lVar27 * -0x3b21 + lVar10;
      lVar10 = lVar23 * 0x187e + lVar10;
      lVar28 = (long)*(short *)((long)pvVar3 + lVar20) * (long)*(short *)((long)coef_block + lVar20)
      ;
      lVar24 = (long)*(short *)((long)pvVar3 + lVar20 + 0x40) *
               (long)*(short *)((long)coef_block + lVar20 + 0x40);
      lVar30 = (long)*(short *)((long)pvVar3 + lVar20 + 0x70) *
               (long)*(short *)((long)coef_block + lVar20 + 0x70);
      lVar25 = (long)*(short *)((long)pvVar3 + lVar20 + 0x50) *
               (long)*(short *)((long)coef_block + lVar20 + 0x50);
      lVar19 = (long)*(short *)((long)pvVar3 + lVar20 + 0x30) *
               (long)*(short *)((long)coef_block + lVar20 + 0x30);
      lVar11 = (long)*(short *)((long)pvVar3 + lVar20 + 0x10) * (long)sVar1;
      lVar23 = (lVar19 + lVar30 + lVar11 + lVar25) * 0x25a1;
      lVar18 = (lVar19 + lVar30) * -0x3ec5 + lVar23;
      lVar23 = (lVar11 + lVar25) * -0xc7c + lVar23;
      lVar27 = (lVar19 + lVar25) * -0x5203;
      lVar5 = (lVar11 + lVar30) * -0x1ccd;
      lVar30 = lVar30 * 0x98e + lVar5 + lVar18;
      lVar18 = lVar19 * 0x6254 + lVar27 + lVar18;
      lVar19 = (lVar24 + lVar28) * 0x2000;
      lVar27 = lVar25 * 0x41b3 + lVar27 + lVar23;
      lVar23 = lVar11 * 0x300b + lVar5 + lVar23;
      lVar11 = lVar19 - lVar10;
      lVar10 = lVar19 + 0x400 + lVar10;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x1c) = (int)((ulong)(lVar10 + lVar23) >> 0xb);
      lVar5 = (lVar28 - lVar24) * 0x2000;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0xfc) = (int)((ulong)(lVar10 - lVar23) >> 0xb);
      lVar23 = lVar5 - lVar14;
      lVar14 = lVar5 + 0x400 + lVar14;
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x3c) = (int)((ulong)(lVar14 + lVar18) >> 0xb);
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0xdc) = (int)((ulong)(lVar14 - lVar18) >> 0xb);
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x5c) = (int)(lVar23 + lVar27 + 0x400U >> 0xb);
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0xbc) =
           (int)((ulong)((lVar23 + 0x400) - lVar27) >> 0xb);
      *(int *)((long)aiStack_154 + lVar20 * 2 + 0x7c) = (int)(lVar11 + lVar30 + 0x400U >> 0xb);
      iVar9 = (int)((ulong)((lVar11 + 0x400) - lVar30) >> 0xb);
      lVar23 = 0x80;
    }
    *(int *)((long)aiStack_154 + lVar20 * 2 + lVar23 + 0x1c) = iVar9;
    uVar16 = uVar16 - 1;
    lVar20 = lVar20 + 2;
  } while (1 < uVar16);
  lVar20 = 7;
  do {
    pJVar21 = (JSAMPLE *)(*(long *)((long)output_buf + lVar20 + -7) + (ulong)output_col);
    iVar9 = aiStack_154[lVar20 + 1];
    iVar22 = aiStack_154[lVar20 + 2];
    if (aiStack_154[lVar20 + 2] == 0 && iVar9 == 0) {
      iVar13 = 0;
      iVar22 = 0;
      if (((aiStack_154[lVar20 + 3] != 0) || (aiStack_154[lVar20 + 4] != 0)) ||
         ((iVar22 = iVar13, aiStack_154[lVar20 + 5] != 0 ||
          ((aiStack_154[lVar20 + 6] != 0 || (aiStack_154[lVar20 + 7] != 0)))))) goto LAB_00146290;
      JVar6 = pJVar2[(ulong)(aiStack_154[lVar20] + 0x10U >> 5 & 0x3ff) + 0x80];
      auVar32 = pshuflw(ZEXT216(CONCAT11(JVar6,JVar6)),ZEXT216(CONCAT11(JVar6,JVar6)),0);
      *(int *)pJVar21 = auVar32._0_4_;
      pJVar21[4] = JVar6;
      pJVar21[5] = JVar6;
      pJVar21[6] = JVar6;
      lVar23 = 7;
    }
    else {
LAB_00146290:
      iVar8 = (aiStack_154[lVar20 + 6] + iVar22) * 0x1151;
      iVar15 = aiStack_154[lVar20 + 6] * -0x3b21 + iVar8;
      iVar8 = iVar22 * 0x187e + iVar8;
      iVar22 = aiStack_154[lVar20 + 3];
      iVar13 = aiStack_154[lVar20 + 7];
      iVar31 = aiStack_154[lVar20 + 5];
      iVar29 = (iVar22 + iVar13 + iVar31 + iVar9) * 0x25a1;
      iVar4 = (iVar22 + iVar13) * -0x3ec5 + iVar29;
      iVar29 = (iVar31 + iVar9) * -0xc7c + iVar29;
      iVar17 = (iVar22 + iVar31) * -0x5203;
      iVar12 = (iVar13 + iVar9) * -0x1ccd;
      iVar13 = iVar13 * 0x98e + iVar12 + iVar4;
      iVar4 = iVar22 * 0x6254 + iVar17 + iVar4;
      iVar26 = (aiStack_154[lVar20 + 4] + aiStack_154[lVar20]) * 0x2000;
      iVar22 = (aiStack_154[lVar20] - aiStack_154[lVar20 + 4]) * 0x2000;
      iVar17 = iVar31 * 0x41b3 + iVar17 + iVar29;
      iVar29 = iVar9 * 0x300b + iVar12 + iVar29;
      iVar31 = iVar26 - iVar8;
      iVar8 = iVar26 + 0x20000 + iVar8;
      iVar9 = iVar22 - iVar15;
      iVar15 = iVar22 + 0x20000 + iVar15;
      *pJVar21 = pJVar2[(ulong)((uint)(iVar8 + iVar29) >> 0x12 & 0x3ff) + 0x80];
      pJVar21[7] = pJVar2[(ulong)((uint)(iVar8 - iVar29) >> 0x12 & 0x3ff) + 0x80];
      pJVar21[1] = pJVar2[(ulong)((uint)(iVar15 + iVar4) >> 0x12 & 0x3ff) + 0x80];
      pJVar21[6] = pJVar2[(ulong)((uint)(iVar15 - iVar4) >> 0x12 & 0x3ff) + 0x80];
      pJVar21[2] = pJVar2[(ulong)(iVar9 + iVar17 + 0x20000U >> 0x12 & 0x3ff) + 0x80];
      pJVar21[5] = pJVar2[(ulong)((uint)((iVar9 + 0x20000) - iVar17) >> 0x12 & 0x3ff) + 0x80];
      pJVar21[3] = pJVar2[(ulong)(iVar31 + iVar13 + 0x20000U >> 0x12 & 0x3ff) + 0x80];
      JVar6 = pJVar2[(ulong)((uint)((iVar31 + 0x20000) - iVar13) >> 0x12 & 0x3ff) + 0x80];
      lVar23 = 4;
    }
    pJVar21[lVar23] = JVar6;
    lVar20 = lVar20 + 8;
    if (lVar20 == 0x47) {
      return;
    }
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_islow(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp2, tmp3;
  JLONG tmp10, tmp11, tmp12, tmp13;
  JLONG z1, z2, z3, z4, z5;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];      /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */
  /* Note results are scaled up by sqrt(8) compared to a true IDCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 4] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 6] == 0 &&
        inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero */
      int dcval = LEFT_SHIFT(DEQUANTIZE(inptr[DCTSIZE * 0],
                             quantptr[DCTSIZE * 0]), PASS1_BITS);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;
      wsptr[DCTSIZE * 4] = dcval;
      wsptr[DCTSIZE * 5] = dcval;
      wsptr[DCTSIZE * 6] = dcval;
      wsptr[DCTSIZE * 7] = dcval;

      inptr++;                  /* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z3, -FIX_1_847759065);
    tmp3 = z1 + MULTIPLY(z2, FIX_0_765366865);

    z2 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);

    tmp0 = LEFT_SHIFT(z2 + z3, CONST_BITS);
    tmp1 = LEFT_SHIFT(z2 - z3, CONST_BITS);

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);

    z1 = tmp0 + tmp3;
    z2 = tmp1 + tmp2;
    z3 = tmp0 + tmp2;
    z4 = tmp1 + tmp3;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    tmp0 += z1 + z3;
    tmp1 += z2 + z4;
    tmp2 += z2 + z3;
    tmp3 += z1 + z4;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    wsptr[DCTSIZE * 0] = (int)DESCALE(tmp10 + tmp3, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 7] = (int)DESCALE(tmp10 - tmp3, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 1] = (int)DESCALE(tmp11 + tmp2, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 6] = (int)DESCALE(tmp11 - tmp2, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 2] = (int)DESCALE(tmp12 + tmp1, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 5] = (int)DESCALE(tmp12 - tmp1, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 3] = (int)DESCALE(tmp13 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[DCTSIZE * 4] = (int)DESCALE(tmp13 - tmp0, CONST_BITS - PASS1_BITS);

    inptr++;                    /* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
        wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int)DESCALE((JLONG)wsptr[0],
                                               PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part: reverse the even part of the forward DCT. */
    /* The rotator is sqrt(2)*c(-6). */

    z2 = (JLONG)wsptr[2];
    z3 = (JLONG)wsptr[6];

    z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    tmp2 = z1 + MULTIPLY(z3, -FIX_1_847759065);
    tmp3 = z1 + MULTIPLY(z2, FIX_0_765366865);

    tmp0 = LEFT_SHIFT((JLONG)wsptr[0] + (JLONG)wsptr[4], CONST_BITS);
    tmp1 = LEFT_SHIFT((JLONG)wsptr[0] - (JLONG)wsptr[4], CONST_BITS);

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    /* Odd part per figure 8; the matrix is unitary and hence its
     * transpose is its inverse.  i0..i3 are y7,y5,y3,y1 respectively.
     */

    tmp0 = (JLONG)wsptr[7];
    tmp1 = (JLONG)wsptr[5];
    tmp2 = (JLONG)wsptr[3];
    tmp3 = (JLONG)wsptr[1];

    z1 = tmp0 + tmp3;
    z2 = tmp1 + tmp2;
    z3 = tmp0 + tmp2;
    z4 = tmp1 + tmp3;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp0 = MULTIPLY(tmp0, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp1 = MULTIPLY(tmp1, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp2 = MULTIPLY(tmp2, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp3 = MULTIPLY(tmp3, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    tmp0 += z1 + z3;
    tmp1 += z2 + z4;
    tmp2 += z2 + z3;
    tmp3 += z1 + z4;

    /* Final output stage: inputs are tmp10..tmp13, tmp0..tmp3 */

    outptr[0] = range_limit[(int)DESCALE(tmp10 + tmp3,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[7] = range_limit[(int)DESCALE(tmp10 - tmp3,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)DESCALE(tmp11 + tmp2,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[6] = range_limit[(int)DESCALE(tmp11 - tmp2,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)DESCALE(tmp12 + tmp1,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[5] = range_limit[(int)DESCALE(tmp12 - tmp1,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)DESCALE(tmp13 + tmp0,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)DESCALE(tmp13 - tmp0,
                                         CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}